

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void set_ext_params_cpy_exx(xc_func_type *p,double *ext_params)

{
  int in_EDX;
  
  copy_params(p,(double *)(ulong)((p->info->ext_params).n - 1),in_EDX);
  p->cam_alpha = p->ext_params[(long)(p->info->ext_params).n + -1];
  return;
}

Assistant:

void
set_ext_params_cpy_exx(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 1;
  copy_params(p, ext_params, nparams);
  set_ext_params_exx(p, ext_params);
}